

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O2

void R_SetupFreelook(void)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  double dVar7;
  float *pfVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar31;
  undefined1 auVar24 [16];
  int iVar32;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  TAngle<double> local_8;
  
  dVar7 = FocalLengthY;
  if (camera == (AActor *)0x0) {
    dVar1 = 0.0;
  }
  else {
    local_8.Degrees = -ViewPitch.Degrees;
    dVar1 = TAngle<double>::Tan(&local_8);
    dVar1 = dVar1 * dVar7;
  }
  iVar31 = viewheight;
  auVar6 = _DAT_00668260;
  CenterY = (double)viewheight * 0.5 + dVar1;
  uVar10 = SUB84(CenterY + 6755399441055744.0,0);
  globaluclip = -CenterY * (1.0 / InvZtoScale);
  globaldclip = ((double)viewheight - CenterY) * (1.0 / InvZtoScale);
  fVar13 = (float)FocalLengthY;
  fVar17 = (float)CenterY;
  centery = uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = 1;
    if (1 < viewheight) {
      uVar11 = (ulong)(uint)viewheight;
    }
    fVar17 = 0.5 - fVar17;
    lVar9 = uVar11 - 1;
    fVar14 = fVar17 + 0.0;
    fVar15 = fVar17 + 1.0;
    fVar16 = fVar17 + 2.0;
    fVar17 = fVar17 + 3.0;
    auVar23._8_4_ = (int)lVar9;
    auVar23._0_8_ = lVar9;
    auVar23._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    auVar23 = auVar23 ^ _DAT_00668260;
    auVar29 = _DAT_006686f0;
    auVar40 = _DAT_00668700;
    do {
      auVar27 = auVar40 ^ auVar6;
      iVar31 = auVar23._4_4_;
      iVar32 = auVar23._12_4_;
      auVar37._4_4_ = fVar15;
      auVar37._0_4_ = fVar14;
      auVar37._8_4_ = fVar16;
      auVar37._12_4_ = fVar17;
      auVar37 = rcpps(in_XMM11,auVar37);
      fVar42 = fVar13 * auVar37._0_4_;
      fVar45 = fVar13 * auVar37._4_4_;
      fVar46 = fVar13 * auVar37._8_4_;
      fVar47 = fVar13 * auVar37._12_4_;
      auVar28._0_4_ = (fVar13 - fVar14 * fVar42) * auVar37._0_4_ + fVar42;
      auVar28._4_4_ = (fVar13 - fVar15 * fVar45) * auVar37._4_4_ + fVar45;
      auVar28._8_4_ = (fVar13 - fVar16 * fVar46) * auVar37._8_4_ + fVar46;
      auVar28._12_4_ = (fVar13 - fVar17 * fVar47) * auVar37._12_4_ + fVar47;
      if ((bool)(~(auVar27._4_4_ == iVar31 && auVar23._0_4_ < auVar27._0_4_ ||
                  iVar31 < auVar27._4_4_) & 1)) {
        *(float *)((long)yslope + lVar9) = auVar28._0_4_;
      }
      if ((auVar27._12_4_ != iVar32 || auVar27._8_4_ <= auVar23._8_4_) && auVar27._12_4_ <= iVar32)
      {
        *(float *)((long)yslope + lVar9 + 4) = auVar28._4_4_;
      }
      auVar37 = auVar29 ^ auVar6;
      in_XMM11._0_4_ = -(uint)(auVar23._0_4_ < auVar37._0_4_);
      in_XMM11._4_4_ = -(uint)(iVar31 < auVar37._4_4_);
      in_XMM11._8_4_ = -(uint)(auVar23._8_4_ < auVar37._8_4_);
      in_XMM11._12_4_ = -(uint)(iVar32 < auVar37._12_4_);
      iVar31 = -(uint)(auVar37._4_4_ == iVar31);
      iVar32 = -(uint)(auVar37._12_4_ == iVar32);
      auVar43._4_4_ = iVar31;
      auVar43._0_4_ = iVar31;
      auVar43._8_4_ = iVar32;
      auVar43._12_4_ = iVar32;
      auVar34._4_4_ = in_XMM11._4_4_;
      auVar34._0_4_ = in_XMM11._4_4_;
      auVar34._8_4_ = in_XMM11._12_4_;
      auVar34._12_4_ = in_XMM11._12_4_;
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar27 = (auVar34 | auVar43 & in_XMM11) ^ auVar27;
      if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar4._4_8_ = in_XMM11._8_8_;
        auVar4._0_4_ = auVar28._4_4_;
        auVar39._0_8_ = auVar4._0_8_ << 0x20;
        auVar39._8_4_ = auVar28._8_4_;
        auVar39._12_4_ = auVar28._12_4_;
        in_XMM11._8_8_ = auVar28._8_8_;
        in_XMM11._0_8_ = auVar39._8_8_;
        *(float *)((long)yslope + lVar9 + 8) = auVar28._8_4_;
      }
      if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(float *)((long)yslope + lVar9 + 0xc) = auVar28._12_4_;
      }
      lVar21 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + 4;
      auVar40._8_8_ = lVar21 + 4;
      lVar21 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 4;
      auVar29._8_8_ = lVar21 + 4;
      fVar14 = fVar14 + 4.0;
      fVar15 = fVar15 + 4.0;
      fVar16 = fVar16 + 4.0;
      fVar17 = fVar17 + 4.0;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)((int)uVar11 + 3U & 0xfffffffc) << 2 != lVar9);
  }
  else {
    fVar14 = fVar17 + -0.5;
    if ((int)uVar10 < viewheight) {
      pfVar8 = yslope + 3;
      uVar11 = (ulong)(uVar10 & 0x7fffffff);
      do {
        pfVar8[-3] = fVar13 / fVar14;
        auVar40 = _DAT_00668700;
        auVar29 = _DAT_006686f0;
        auVar6 = _DAT_00668260;
        fVar14 = fVar14 + -1.0;
        pfVar8 = pfVar8 + 1;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      iVar32 = uVar10 + 1;
      if ((int)(uVar10 + 1) < iVar31) {
        iVar32 = iVar31;
      }
      uVar12 = ~uVar10 + iVar32;
      fVar17 = (float)(int)uVar10 + (0.5 - fVar17);
      fVar14 = fVar17 + 0.0;
      fVar15 = fVar17 + 1.0;
      fVar16 = fVar17 + 2.0;
      fVar17 = fVar17 + 3.0;
      auVar18._4_4_ = 0;
      auVar18._0_4_ = uVar12;
      auVar18._8_4_ = uVar12;
      auVar18._12_4_ = 0;
      uVar11 = 0;
      auVar18 = auVar18 ^ _DAT_00668260;
      do {
        auVar24._8_4_ = (int)uVar11;
        auVar24._0_8_ = uVar11;
        auVar24._12_4_ = (int)(uVar11 >> 0x20);
        auVar23 = (auVar24 | auVar40) ^ auVar6;
        iVar31 = auVar18._4_4_;
        iVar32 = auVar18._12_4_;
        auVar2._4_4_ = fVar15;
        auVar2._0_4_ = fVar14;
        auVar2._8_4_ = fVar16;
        auVar2._12_4_ = fVar17;
        auVar37 = rcpps(in_XMM11,auVar2);
        fVar42 = fVar13 * auVar37._0_4_;
        fVar45 = fVar13 * auVar37._4_4_;
        fVar46 = fVar13 * auVar37._8_4_;
        fVar47 = fVar13 * auVar37._12_4_;
        if ((bool)(~(auVar23._4_4_ == iVar31 && auVar18._0_4_ < auVar23._0_4_ ||
                    iVar31 < auVar23._4_4_) & 1)) {
          pfVar8[-3] = (fVar13 - fVar14 * fVar42) * auVar37._0_4_ + fVar42;
        }
        if ((auVar23._12_4_ != iVar32 || auVar23._8_4_ <= auVar18._8_4_) && auVar23._12_4_ <= iVar32
           ) {
          pfVar8[-2] = (fVar13 - fVar15 * fVar45) * auVar37._4_4_ + fVar45;
        }
        auVar23 = (auVar24 | auVar29) ^ auVar6;
        auVar33._0_4_ = -(uint)(auVar18._0_4_ < auVar23._0_4_);
        auVar33._4_4_ = -(uint)(iVar31 < auVar23._4_4_);
        auVar33._8_4_ = -(uint)(auVar18._8_4_ < auVar23._8_4_);
        auVar33._12_4_ = -(uint)(iVar32 < auVar23._12_4_);
        iVar31 = -(uint)(auVar23._4_4_ == iVar31);
        iVar32 = -(uint)(auVar23._12_4_ == iVar32);
        auVar38._4_4_ = iVar31;
        auVar38._0_4_ = iVar31;
        auVar38._8_4_ = iVar32;
        auVar38._12_4_ = iVar32;
        in_XMM11 = auVar38 & auVar33;
        auVar25._4_4_ = auVar33._4_4_;
        auVar25._0_4_ = auVar33._4_4_;
        auVar25._8_4_ = auVar33._12_4_;
        auVar25._12_4_ = auVar33._12_4_;
        auVar26._8_4_ = 0xffffffff;
        auVar26._0_8_ = 0xffffffffffffffff;
        auVar26._12_4_ = 0xffffffff;
        auVar26 = (auVar25 | in_XMM11) ^ auVar26;
        if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pfVar8[-1] = (fVar13 - fVar16 * fVar46) * auVar37._8_4_ + fVar46;
        }
        if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *pfVar8 = (fVar13 - fVar17 * fVar47) * auVar37._12_4_ + fVar47;
        }
        uVar11 = uVar11 + 4;
        fVar14 = fVar14 + 4.0;
        fVar15 = fVar15 + 4.0;
        fVar16 = fVar16 + 4.0;
        fVar17 = fVar17 + 4.0;
        pfVar8 = pfVar8 + 4;
      } while (((ulong)uVar12 + 4 & 0xfffffffffffffffc) != uVar11);
    }
    else {
      uVar11 = 1;
      if (1 < viewheight) {
        uVar11 = (ulong)(uint)viewheight;
      }
      lVar9 = uVar11 - 1;
      fVar17 = fVar14 + -0.0;
      fVar15 = fVar14 + -1.0;
      fVar16 = fVar14 + -2.0;
      fVar14 = fVar14 + -3.0;
      auVar19._8_4_ = (int)lVar9;
      auVar19._0_8_ = lVar9;
      auVar19._12_4_ = (int)((ulong)lVar9 >> 0x20);
      lVar9 = 0;
      auVar19 = auVar19 ^ _DAT_00668260;
      auVar20 = _DAT_006686f0;
      auVar22 = _DAT_00668700;
      do {
        auVar29 = auVar22 ^ auVar6;
        iVar31 = auVar19._4_4_;
        iVar32 = auVar19._12_4_;
        auVar3._4_4_ = fVar15;
        auVar3._0_4_ = fVar17;
        auVar3._8_4_ = fVar16;
        auVar3._12_4_ = fVar14;
        auVar40 = rcpps(in_XMM11,auVar3);
        fVar42 = fVar13 * auVar40._0_4_;
        fVar45 = fVar13 * auVar40._4_4_;
        fVar46 = fVar13 * auVar40._8_4_;
        fVar47 = fVar13 * auVar40._12_4_;
        auVar30._0_4_ = (fVar13 - fVar17 * fVar42) * auVar40._0_4_ + fVar42;
        auVar30._4_4_ = (fVar13 - fVar15 * fVar45) * auVar40._4_4_ + fVar45;
        auVar30._8_4_ = (fVar13 - fVar16 * fVar46) * auVar40._8_4_ + fVar46;
        auVar30._12_4_ = (fVar13 - fVar14 * fVar47) * auVar40._12_4_ + fVar47;
        if ((bool)(~(auVar29._4_4_ == iVar31 && auVar19._0_4_ < auVar29._0_4_ ||
                    iVar31 < auVar29._4_4_) & 1)) {
          *(float *)((long)yslope + lVar9) = auVar30._0_4_;
        }
        if ((auVar29._12_4_ != iVar32 || auVar29._8_4_ <= auVar19._8_4_) && auVar29._12_4_ <= iVar32
           ) {
          *(float *)((long)yslope + lVar9 + 4) = auVar30._4_4_;
        }
        auVar29 = auVar20 ^ auVar6;
        in_XMM11._0_4_ = -(uint)(auVar19._0_4_ < auVar29._0_4_);
        in_XMM11._4_4_ = -(uint)(iVar31 < auVar29._4_4_);
        in_XMM11._8_4_ = -(uint)(auVar19._8_4_ < auVar29._8_4_);
        in_XMM11._12_4_ = -(uint)(iVar32 < auVar29._12_4_);
        iVar31 = -(uint)(auVar29._4_4_ == iVar31);
        iVar32 = -(uint)(auVar29._12_4_ == iVar32);
        auVar44._4_4_ = iVar31;
        auVar44._0_4_ = iVar31;
        auVar44._8_4_ = iVar32;
        auVar44._12_4_ = iVar32;
        auVar35._4_4_ = in_XMM11._4_4_;
        auVar35._0_4_ = in_XMM11._4_4_;
        auVar35._8_4_ = in_XMM11._12_4_;
        auVar35._12_4_ = in_XMM11._12_4_;
        auVar36._8_4_ = 0xffffffff;
        auVar36._0_8_ = 0xffffffffffffffff;
        auVar36._12_4_ = 0xffffffff;
        auVar36 = (auVar35 | auVar44 & in_XMM11) ^ auVar36;
        if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          auVar5._4_8_ = in_XMM11._8_8_;
          auVar5._0_4_ = auVar30._4_4_;
          auVar41._0_8_ = auVar5._0_8_ << 0x20;
          auVar41._8_4_ = auVar30._8_4_;
          auVar41._12_4_ = auVar30._12_4_;
          in_XMM11._8_8_ = auVar30._8_8_;
          in_XMM11._0_8_ = auVar41._8_8_;
          *(float *)((long)yslope + lVar9 + 8) = auVar30._8_4_;
        }
        if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(float *)((long)yslope + lVar9 + 0xc) = auVar30._12_4_;
        }
        lVar21 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar21 + 4;
        lVar21 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar21 + 4;
        fVar17 = fVar17 + -4.0;
        fVar15 = fVar15 + -4.0;
        fVar16 = fVar16 + -4.0;
        fVar14 = fVar14 + -4.0;
        lVar9 = lVar9 + 0x10;
      } while ((ulong)((int)uVar11 + 3U & 0xfffffffc) << 2 != lVar9);
    }
  }
  return;
}

Assistant:

void R_SetupFreelook()
{
	double dy;
		
	if (camera != NULL)
	{
		dy = FocalLengthY * (-ViewPitch).Tan();
	}
	else
	{
		dy = 0;
	}

	CenterY = (viewheight / 2.0) + dy;
	centery = xs_ToInt(CenterY);
	globaluclip = -CenterY / InvZtoScale;
	globaldclip = (viewheight - CenterY) / InvZtoScale;

	//centeryfrac &= 0xffff0000;
	int e, i;

	i = 0;
	e = viewheight;
	float focus = float(FocalLengthY);
	float den;
	float cy = float(CenterY);
	if (i < centery)
	{
		den = cy - i - 0.5f;
		if (e <= centery)
		{
			do {
				yslope[i] = focus / den;
				den -= 1;
			} while (++i < e);
		}
		else
		{
			do {
				yslope[i] = focus / den;
				den -= 1;
			} while (++i < centery);
			den = i - cy + 0.5f;
			do {
				yslope[i] = focus / den;
				den += 1;
			} while (++i < e);
		}
	}
	else
	{
		den = i - cy + 0.5f;
		do {
			yslope[i] = focus / den;
			den += 1;
		} while (++i < e);
	}
}